

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O1

LoadStatus __thiscall DepsLog::Load(DepsLog *this,string *path,State *state,string *err)

{
  pointer *pppNVar1;
  iterator __position;
  pointer ppNVar2;
  Node *pNVar3;
  Metrics *this_00;
  bool bVar4;
  int iVar5;
  FILE *__stream;
  char *pcVar6;
  size_t sVar7;
  size_t size_00;
  Deps *deps;
  Node **ppNVar8;
  char *pcVar9;
  int *piVar10;
  Metric *pMVar11;
  uint uVar12;
  LoadStatus LVar13;
  bool bVar14;
  ulong uVar15;
  uint uVar16;
  string *err_00;
  bool bVar17;
  StringPiece path_00;
  int version;
  uint size;
  Node *node;
  ScopedMetric metrics_h_scoped;
  char buf [524288];
  int iStack_800c8;
  uint uStack_800c4;
  State *pSStack_800c0;
  ulong uStack_800b8;
  ulong uStack_800b0;
  int iStack_800a4;
  string *psStack_800a0;
  DepsLog *pDStack_80098;
  string *psStack_80090;
  vector<Node*,std::allocator<Node*>> *pvStack_80088;
  size_t sStack_80080;
  ulong uStack_80078;
  Node *pNStack_80070;
  string sStack_80068;
  ScopedMetric SStack_80048;
  int iStack_80038;
  uint uStack_80034;
  uint uStack_80030;
  undefined1 auStack_8002c [524284];
  
  if ((Load(std::__cxx11::string_const&,State*,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Load(std::__cxx11::string_const&,State*,std::__cxx11::string*)::
                                   metrics_h_metric), this_00 = g_metrics, iVar5 != 0)) {
    pSStack_800c0 = state;
    if (g_metrics == (Metrics *)0x0) {
      pMVar11 = (Metric *)0x0;
    }
    else {
      sStack_80068._M_dataplus._M_p = (pointer)&sStack_80068.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_80068,".ninja_deps load","")
      ;
      pMVar11 = Metrics::NewMetric(this_00,&sStack_80068);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_80068._M_dataplus._M_p != &sStack_80068.field_2) {
        operator_delete(sStack_80068._M_dataplus._M_p,sStack_80068.field_2._M_allocated_capacity + 1
                       );
      }
    }
    Load::metrics_h_metric = pMVar11;
    __cxa_guard_release(&Load(std::__cxx11::string_const&,State*,std::__cxx11::string*)::
                         metrics_h_metric);
    state = pSStack_800c0;
  }
  ScopedMetric::ScopedMetric(&SStack_80048,Load::metrics_h_metric);
  __stream = fopen((path->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    piVar10 = __errno_location();
    LVar13 = LOAD_NOT_FOUND;
    if (*piVar10 != 2) {
      pcVar9 = strerror(*piVar10);
      pcVar6 = (char *)err->_M_string_length;
      strlen(pcVar9);
      LVar13 = LOAD_ERROR;
      std::__cxx11::string::_M_replace((ulong)err,0,pcVar6,(ulong)pcVar9);
    }
  }
  else {
    iStack_800c8 = 0;
    pcVar6 = fgets((char *)&iStack_80038,0x80000,__stream);
    if ((((pcVar6 == (char *)0x0) || (sVar7 = fread(&iStack_800c8,4,1,__stream), sVar7 == 0)) ||
        (CONCAT17(auStack_8002c[0],CONCAT43(uStack_80030,uStack_80034._1_3_)) != 0xa73706564616a ||
         CONCAT44(uStack_80034,iStack_80038) != 0x64616a6e696e2023)) || (iStack_800c8 != 4)) {
      pcVar6 = "bad deps log signature or version; starting over";
      if (iStack_800c8 == 1) {
        pcVar6 = "deps log version change; rebuilding";
      }
      std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,(ulong)pcVar6);
      fclose(__stream);
      unlink((path->_M_dataplus)._M_p);
      LVar13 = LOAD_SUCCESS;
    }
    else {
      pvStack_80088 = (vector<Node*,std::allocator<Node*>> *)&this->nodes_;
      uStack_800b0 = 0;
      uStack_800b8 = 0;
      pSStack_800c0 = state;
      psStack_800a0 = err;
      pDStack_80098 = this;
      psStack_80090 = path;
      bVar4 = false;
      do {
        size_00 = ftell(__stream);
        sVar7 = fread(&uStack_800c4,4,1,__stream);
        uVar16 = uStack_800c4;
        if (sVar7 == 0) {
          iVar5 = feof(__stream);
          if (iVar5 == 0) {
            bVar4 = true;
          }
          bVar17 = false;
          bVar14 = bVar4;
        }
        else {
          uVar12 = uStack_800c4 & 0x7fffffff;
          uStack_800c4 = uVar12;
          if ((uVar12 < 0x80000) &&
             (sVar7 = fread(&iStack_80038,(ulong)uVar12,1,__stream), sVar7 != 0)) {
            if ((int)uVar16 < 0) {
              if ((uVar16 & 3) != 0) {
                __assert_fail("size % 4 == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log.cc"
                              ,0xce,"LoadStatus DepsLog::Load(const string &, State *, string *)");
              }
              iStack_800a4 = iStack_80038;
              uStack_80078 = (ulong)uStack_80034;
              uVar15 = (ulong)uStack_80030;
              sStack_80080 = size_00;
              deps = (Deps *)operator_new(0x18);
              uVar16 = (uVar12 >> 2) - 3;
              deps->mtime = (uVar15 << 0x20) + uStack_80078;
              deps->node_count = uVar16;
              uVar15 = (long)(int)uVar16 << 3;
              if (uVar12 < 0xc) {
                uVar15 = 0xffffffffffffffff;
              }
              ppNVar8 = (Node **)operator_new__(uVar15);
              deps->nodes = ppNVar8;
              if (0xc < uVar12) {
                if ((int)uVar16 < 2) {
                  uVar16 = 1;
                }
                uVar15 = 0;
                do {
                  ppNVar2 = (pDStack_80098->nodes_).
                            super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  if ((int)((ulong)((long)(pDStack_80098->nodes_).
                                          super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar2)
                           >> 3) <= *(int *)(auStack_8002c + uVar15 * 4)) {
                    __assert_fail("deps_data[i] < (int)nodes_.size()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log.cc"
                                  ,0xd9,
                                  "LoadStatus DepsLog::Load(const string &, State *, string *)");
                  }
                  pNVar3 = ppNVar2[*(int *)(auStack_8002c + uVar15 * 4)];
                  if (pNVar3 == (Node *)0x0) {
                    __assert_fail("nodes_[deps_data[i]]",
                                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log.cc"
                                  ,0xda,
                                  "LoadStatus DepsLog::Load(const string &, State *, string *)");
                  }
                  deps->nodes[uVar15] = pNVar3;
                  uVar15 = uVar15 + 1;
                } while (uVar16 != uVar15);
              }
              bVar17 = UpdateDeps(pDStack_80098,iStack_800a4,deps);
              uStack_800b0 = (ulong)((int)uStack_800b0 + 1);
              uStack_800b8 = (ulong)((int)uStack_800b8 + (uint)!bVar17);
              bVar17 = true;
              size_00 = sStack_80080;
              this = pDStack_80098;
              bVar14 = bVar4;
            }
            else {
              if (uVar12 < 5) {
                __assert_fail("path_size > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log.cc"
                              ,0xe3,"LoadStatus DepsLog::Load(const string &, State *, string *)");
              }
              uVar16 = uVar12 - 4;
              if (*(char *)((long)&iStack_80038 + (ulong)(uVar12 - 5)) == '\0') {
                uVar16 = uVar12 - 5;
              }
              if (*(char *)((long)&SStack_80048.start_ + (long)(int)uVar16 + 7) == '\0') {
                uVar16 = uVar16 - 1;
              }
              if (*(char *)((long)&SStack_80048.start_ + (long)(int)uVar16 + 7) == '\0') {
                uVar16 = uVar16 - 1;
              }
              path_00.len_ = (size_t)(int)uVar16;
              path_00.str_ = (char *)&iStack_80038;
              pNStack_80070 = State::GetNode(pSStack_800c0,path_00,0);
              __position._M_current =
                   (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              uVar16 = (uint)((ulong)((long)__position._M_current -
                                     (long)(this->nodes_).
                                           super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 3);
              bVar17 = (*(uint *)((long)&SStack_80048.start_ + (ulong)uVar12 + 4) ^ uVar16) ==
                       0xffffffff;
              bVar14 = true;
              if (bVar17) {
                if (-1 < pNStack_80070->id_) {
                  __assert_fail("node->id() < 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log.cc"
                                ,0xfc,"LoadStatus DepsLog::Load(const string &, State *, string *)")
                  ;
                }
                pNStack_80070->id_ = uVar16;
                if (__position._M_current ==
                    (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                            (pvStack_80088,__position,&pNStack_80070);
                  bVar14 = bVar4;
                }
                else {
                  *__position._M_current = pNStack_80070;
                  pppNVar1 = &(this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
                  *pppNVar1 = *pppNVar1 + 1;
                  bVar14 = bVar4;
                }
              }
            }
          }
          else {
            bVar17 = false;
            bVar14 = true;
          }
        }
        bVar4 = bVar14;
      } while (bVar17);
      if (bVar14) {
        iVar5 = ferror(__stream);
        err_00 = psStack_800a0;
        if (iVar5 == 0) {
          std::__cxx11::string::_M_replace
                    ((ulong)psStack_800a0,0,(char *)psStack_800a0->_M_string_length,0x127e10);
        }
        else {
          pcVar9 = strerror(iVar5);
          err_00 = psStack_800a0;
          pcVar6 = (char *)psStack_800a0->_M_string_length;
          strlen(pcVar9);
          std::__cxx11::string::_M_replace((ulong)err_00,0,pcVar6,(ulong)pcVar9);
        }
        fclose(__stream);
        bVar4 = Truncate(psStack_80090,size_00,err_00);
        LVar13 = LOAD_ERROR;
        if (bVar4) {
          LVar13 = LOAD_SUCCESS;
          std::__cxx11::string::append((char *)err_00);
        }
      }
      else {
        fclose(__stream);
        LVar13 = LOAD_SUCCESS;
        if ((1000 < (int)uStack_800b0) && ((int)uStack_800b8 * 3 < (int)uStack_800b0)) {
          this->needs_recompaction_ = true;
        }
      }
    }
  }
  ScopedMetric::~ScopedMetric(&SStack_80048);
  return LVar13;
}

Assistant:

LoadStatus DepsLog::Load(const string& path, State* state, string* err) {
  METRIC_RECORD(".ninja_deps load");
  char buf[kMaxRecordSize + 1];
  FILE* f = fopen(path.c_str(), "rb");
  if (!f) {
    if (errno == ENOENT)
      return LOAD_NOT_FOUND;
    *err = strerror(errno);
    return LOAD_ERROR;
  }

  bool valid_header = true;
  int version = 0;
  if (!fgets(buf, sizeof(buf), f) || fread(&version, 4, 1, f) < 1)
    valid_header = false;
  // Note: For version differences, this should migrate to the new format.
  // But the v1 format could sometimes (rarely) end up with invalid data, so
  // don't migrate v1 to v3 to force a rebuild. (v2 only existed for a few days,
  // and there was no release with it, so pretend that it never happened.)
  if (!valid_header || strcmp(buf, kFileSignature) != 0 ||
      version != kCurrentVersion) {
    if (version == 1)
      *err = "deps log version change; rebuilding";
    else
      *err = "bad deps log signature or version; starting over";
    fclose(f);
    unlink(path.c_str());
    // Don't report this as a failure.  An empty deps log will cause
    // us to rebuild the outputs anyway.
    return LOAD_SUCCESS;
  }

  long offset;
  bool read_failed = false;
  int unique_dep_record_count = 0;
  int total_dep_record_count = 0;
  for (;;) {
    offset = ftell(f);

    unsigned size;
    if (fread(&size, 4, 1, f) < 1) {
      if (!feof(f))
        read_failed = true;
      break;
    }
    bool is_deps = (size >> 31) != 0;
    size = size & 0x7FFFFFFF;

    if (size > kMaxRecordSize || fread(buf, size, 1, f) < 1) {
      read_failed = true;
      break;
    }

    if (is_deps) {
      assert(size % 4 == 0);
      int* deps_data = reinterpret_cast<int*>(buf);
      int out_id = deps_data[0];
      TimeStamp mtime;
      mtime = (TimeStamp)(((uint64_t)(unsigned int)deps_data[2] << 32) |
                          (uint64_t)(unsigned int)deps_data[1]);
      deps_data += 3;
      int deps_count = (size / 4) - 3;

      Deps* deps = new Deps(mtime, deps_count);
      for (int i = 0; i < deps_count; ++i) {
        assert(deps_data[i] < (int)nodes_.size());
        assert(nodes_[deps_data[i]]);
        deps->nodes[i] = nodes_[deps_data[i]];
      }

      total_dep_record_count++;
      if (!UpdateDeps(out_id, deps))
        ++unique_dep_record_count;
    } else {
      int path_size = size - 4;
      assert(path_size > 0);  // CanonicalizePath() rejects empty paths.
      // There can be up to 3 bytes of padding.
      if (buf[path_size - 1] == '\0') --path_size;
      if (buf[path_size - 1] == '\0') --path_size;
      if (buf[path_size - 1] == '\0') --path_size;
      StringPiece subpath(buf, path_size);
      // It is not necessary to pass in a correct slash_bits here. It will
      // either be a Node that's in the manifest (in which case it will already
      // have a correct slash_bits that GetNode will look up), or it is an
      // implicit dependency from a .d which does not affect the build command
      // (and so need not have its slashes maintained).
      Node* node = state->GetNode(subpath, 0);

      // Check that the expected index matches the actual index. This can only
      // happen if two ninja processes write to the same deps log concurrently.
      // (This uses unary complement to make the checksum look less like a
      // dependency record entry.)
      unsigned checksum = *reinterpret_cast<unsigned*>(buf + size - 4);
      int expected_id = ~checksum;
      int id = nodes_.size();
      if (id != expected_id) {
        read_failed = true;
        break;
      }

      assert(node->id() < 0);
      node->set_id(id);
      nodes_.push_back(node);
    }
  }

  if (read_failed) {
    // An error occurred while loading; try to recover by truncating the
    // file to the last fully-read record.
    if (ferror(f)) {
      *err = strerror(ferror(f));
    } else {
      *err = "premature end of file";
    }
    fclose(f);

    if (!Truncate(path, offset, err))
      return LOAD_ERROR;

    // The truncate succeeded; we'll just report the load error as a
    // warning because the build can proceed.
    *err += "; recovering";
    return LOAD_SUCCESS;
  }

  fclose(f);

  // Rebuild the log if there are too many dead records.
  int kMinCompactionEntryCount = 1000;
  int kCompactionRatio = 3;
  if (total_dep_record_count > kMinCompactionEntryCount &&
      total_dep_record_count > unique_dep_record_count * kCompactionRatio) {
    needs_recompaction_ = true;
  }

  return LOAD_SUCCESS;
}